

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O0

void __thiscall
Atari2600::TIA::Player::dequeue_pixels
          (Player *this,uint8_t *target,uint8_t collision_identity,int time_now)

{
  int count;
  int length;
  uint8_t *start_ptr;
  int time_now_local;
  uint8_t collision_identity_local;
  uint8_t *target_local;
  Player *this_local;
  
  while( true ) {
    if (this->queue_read_pointer_ == this->queue_write_pointer_) {
      return;
    }
    if (time_now < this->queue_[this->queue_read_pointer_].end) break;
    output_pixels(this,target + this->queue_[this->queue_read_pointer_].start,
                  this->queue_[this->queue_read_pointer_].end -
                  this->queue_[this->queue_read_pointer_].start,collision_identity,
                  this->queue_[this->queue_read_pointer_].pixel_position,
                  this->queue_[this->queue_read_pointer_].adder,
                  this->queue_[this->queue_read_pointer_].reverse_mask);
    this->queue_read_pointer_ = this->queue_read_pointer_ + 1U & 3;
  }
  count = time_now - this->queue_[this->queue_read_pointer_].start;
  output_pixels(this,target + this->queue_[this->queue_read_pointer_].start,count,collision_identity
                ,this->queue_[this->queue_read_pointer_].pixel_position,
                this->queue_[this->queue_read_pointer_].adder,
                this->queue_[this->queue_read_pointer_].reverse_mask);
  this->queue_[this->queue_read_pointer_].pixel_position =
       count * this->queue_[this->queue_read_pointer_].adder +
       this->queue_[this->queue_read_pointer_].pixel_position;
  this->queue_[this->queue_read_pointer_].start = time_now;
  return;
}

Assistant:

void dequeue_pixels(uint8_t *const target, const uint8_t collision_identity, const int time_now) {
				while(queue_read_pointer_ != queue_write_pointer_) {
					uint8_t *const start_ptr = &target[queue_[queue_read_pointer_].start];
					if(queue_[queue_read_pointer_].end > time_now) {
						const int length = time_now - queue_[queue_read_pointer_].start;
						output_pixels(start_ptr, length, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
						queue_[queue_read_pointer_].pixel_position += length * queue_[queue_read_pointer_].adder;
						queue_[queue_read_pointer_].start = time_now;
						return;
					} else {
						output_pixels(start_ptr, queue_[queue_read_pointer_].end - queue_[queue_read_pointer_].start, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
					}
					queue_read_pointer_ = (queue_read_pointer_ + 1)&3;
				}
			}